

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix3.hpp
# Opt level: O1

void OpenMD::SquareMatrix3<double>::diagonalize
               (SquareMatrix3<double> *a,Vector3<double> *w,SquareMatrix3<double> *v)

{
  ulong uVar1;
  undefined8 *puVar2;
  double *pdVar3;
  double (*padVar4) [3];
  ulong *puVar5;
  ulong *puVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  uint i_2;
  uint uVar11;
  double *pdVar12;
  uint i;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  double *pdVar16;
  long lVar17;
  double (*padVar18) [3];
  ulong uVar19;
  ulong uVar20;
  undefined4 uVar21;
  double tmp;
  undefined4 uVar22;
  double dVar23;
  double dVar24;
  Vector3<double> v_k;
  SquareMatrix<double,_3> m;
  double local_b8 [4];
  double local_98 [10];
  double local_48;
  double dStack_40;
  double local_38;
  undefined8 uStack_30;
  double local_28;
  double dStack_20;
  
  local_b8[0] = 0.0;
  local_b8[1] = 0.0;
  local_b8[2] = 0.0;
  SquareMatrix<double,_3>::jacobi
            (&a->super_SquareMatrix<double,_3>,&w->super_Vector<double,_3U>,
             &v->super_SquareMatrix<double,_3>);
  dVar23 = (w->super_Vector<double,_3U>).data_[0];
  if (((dVar23 != (w->super_Vector<double,_3U>).data_[1]) ||
      (pdVar12 = (w->super_Vector<double,_3U>).data_ + 2, dVar23 != *pdVar12)) ||
     (NAN(dVar23) || NAN(*pdVar12))) {
    pdVar12 = local_98;
    local_98[6] = 0.0;
    local_98[7] = 0.0;
    local_98[4] = 0.0;
    local_98[5] = 0.0;
    local_98[2] = 0.0;
    local_98[3] = 0.0;
    local_98[0] = 0.0;
    local_98[1] = 0.0;
    local_98[8] = 0.0;
    lVar14 = 0;
    padVar18 = (double (*) [3])v;
    do {
      lVar17 = 0;
      pdVar16 = pdVar12;
      do {
        *pdVar16 = (((SquareMatrix<double,_3> *)*padVar18)->super_RectMatrix<double,_3U,_3U>).data_
                   [0][lVar17];
        lVar17 = lVar17 + 1;
        pdVar16 = pdVar16 + 3;
      } while (lVar17 != 3);
      lVar14 = lVar14 + 1;
      pdVar12 = pdVar12 + 1;
      padVar18 = padVar18 + 1;
    } while (lVar14 != 3);
    lVar14 = 0;
    do {
      *(undefined8 *)
       ((long)(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0] +
       lVar14 + 0x10) = *(undefined8 *)((long)local_98 + lVar14 + 0x10);
      uVar7 = *(undefined8 *)((long)local_98 + lVar14 + 8);
      puVar2 = (undefined8 *)
               ((long)(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0] +
               lVar14);
      *puVar2 = *(undefined8 *)((long)local_98 + lVar14);
      puVar2[1] = uVar7;
      lVar14 = lVar14 + 0x18;
    } while (lVar14 != 0x48);
    uVar15 = 2;
    pdVar12 = (double *)v;
    uVar1 = 0;
    do {
      uVar19 = uVar1;
      pdVar16 = pdVar12;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar15;
      if ((int)uVar19 == 3) {
        dVar23 = ABS((v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][0]
                    );
        uVar11 = 0;
        uVar13 = 1;
        lVar14 = 0x18;
        do {
          dVar24 = ABS(*(double *)
                        ((long)(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                               data_[0] + lVar14));
          uVar10 = uVar13;
          if (dVar24 <= dVar23) {
            dVar24 = dVar23;
            uVar10 = uVar11;
          }
          uVar11 = uVar10;
          dVar23 = dVar24;
          uVar13 = uVar13 + 1;
          lVar14 = lVar14 + 0x18;
        } while (lVar14 != 0x48);
        if (uVar11 != 0) {
          dVar23 = (w->super_Vector<double,_3U>).data_[uVar11];
          (w->super_Vector<double,_3U>).data_[uVar11] = (w->super_Vector<double,_3U>).data_[0];
          (w->super_Vector<double,_3U>).data_[0] = dVar23;
          lVar14 = 0;
          do {
            dVar23 = (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                     [uVar11][lVar14];
            (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[uVar11]
            [lVar14] = (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
                       [lVar14];
            (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar14] =
                 dVar23;
            lVar14 = lVar14 + 1;
          } while (lVar14 != 3);
        }
        if (ABS((v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][1]) <
            ABS((v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][1])) {
          auVar8 = *(undefined1 (*) [16])((w->super_Vector<double,_3U>).data_ + 1);
          auVar9._8_4_ = auVar8._0_4_;
          auVar9._0_8_ = auVar8._8_8_;
          auVar9._12_4_ = auVar8._4_4_;
          *(undefined1 (*) [16])((w->super_Vector<double,_3U>).data_ + 1) = auVar9;
          lVar14 = -0x18;
          do {
            uVar7 = *(undefined8 *)
                     ((long)v[1].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                            data_[0] + lVar14);
            *(undefined8 *)
             ((long)v[1].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
             lVar14) = *(undefined8 *)
                        ((long)(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                               data_[2] + lVar14);
            *(undefined8 *)
             ((long)(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2] +
             lVar14) = uVar7;
            lVar14 = lVar14 + 8;
          } while (lVar14 != 0);
        }
        lVar14 = 0x10;
        pdVar12 = (double *)v;
        do {
          if (*pdVar12 <= 0.0 && *pdVar12 != 0.0) {
            puVar5 = (ulong *)((long)((v->super_SquareMatrix<double,_3>).
                                      super_RectMatrix<double,_3U,_3U>.data_ + -1) + 8 + lVar14);
            uVar1 = puVar5[1];
            puVar6 = (ulong *)((long)((v->super_SquareMatrix<double,_3>).
                                      super_RectMatrix<double,_3U,_3U>.data_ + -1) + 8 + lVar14);
            *puVar6 = *puVar5 ^ 0x8000000000000000;
            puVar6[1] = uVar1 ^ 0x8000000000000000;
            *(ulong *)((long)(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                             data_[0] + lVar14) =
                 *(ulong *)((long)(v->super_SquareMatrix<double,_3>).
                                  super_RectMatrix<double,_3U,_3U>.data_[0] + lVar14) ^
                 0x8000000000000000;
          }
          lVar14 = lVar14 + 0x18;
          pdVar12 = pdVar12 + 4;
        } while (lVar14 == 0x28);
        dVar23 = determinant(v);
        if (dVar23 < 0.0) {
          uVar11 = *(uint *)((long)(v->super_SquareMatrix<double,_3>).
                                   super_RectMatrix<double,_3U,_3U>.data_[2] + 4);
          dVar23 = (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][1];
          *(undefined4 *)
           (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2] =
               *(undefined4 *)
                (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2];
          *(uint *)((long)(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                          [2] + 4) = uVar11 ^ 0x80000000;
          *(int *)((v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2] + 1)
               = SUB84(dVar23,0);
          *(uint *)((long)(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                          [2] + 0xc) = (uint)((ulong)dVar23 >> 0x20) ^ 0x80000000;
          uVar11 = *(uint *)((long)(v->super_SquareMatrix<double,_3>).
                                   super_RectMatrix<double,_3U,_3U>.data_[2] + 0x14);
          *(undefined4 *)
           ((v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2] + 2) =
               *(undefined4 *)
                ((v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2] + 2);
          *(uint *)((long)(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                          [2] + 0x14) = uVar11 ^ 0x80000000;
        }
        pdVar12 = local_98;
        local_98[6] = 0.0;
        local_98[7] = 0.0;
        local_98[4] = 0.0;
        local_98[5] = 0.0;
        local_98[2] = 0.0;
        local_98[3] = 0.0;
        local_98[0] = 0.0;
        local_98[1] = 0.0;
        local_98[8] = 0.0;
        lVar14 = 0;
        padVar18 = (double (*) [3])v;
        do {
          lVar17 = 0;
          pdVar16 = pdVar12;
          do {
            *pdVar16 = (((SquareMatrix<double,_3> *)*padVar18)->super_RectMatrix<double,_3U,_3U>).
                       data_[0][lVar17];
            lVar17 = lVar17 + 1;
            pdVar16 = pdVar16 + 3;
          } while (lVar17 != 3);
          lVar14 = lVar14 + 1;
          pdVar12 = pdVar12 + 1;
          padVar18 = padVar18 + 1;
        } while (lVar14 != 3);
        lVar14 = 0;
        do {
          *(undefined8 *)
           ((long)(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0] +
           lVar14 + 0x10) = *(undefined8 *)((long)local_98 + lVar14 + 0x10);
          uVar7 = *(undefined8 *)((long)local_98 + lVar14 + 8);
          puVar2 = (undefined8 *)
                   ((long)(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                          [0] + lVar14);
          *puVar2 = *(undefined8 *)((long)local_98 + lVar14);
          puVar2[1] = uVar7;
          lVar14 = lVar14 + 0x18;
        } while (lVar14 != 0x48);
        return;
      }
      uVar1 = uVar19 + 1;
      uVar20 = uVar1 & 0xffffffff;
      if ((int)uVar19 == 2) {
        uVar20 = 0;
      }
      dVar23 = (w->super_Vector<double,_3U>).data_[uVar20];
      pdVar12 = pdVar16 + 3;
      uVar15 = uVar15 + 1;
      pdVar3 = (double *)
               ((long)w +
               uVar19 * 8 +
               (SUB168(auVar8 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0x3ffffffffffffffe) * -0xc + 0x10);
    } while ((dVar23 != *pdVar3) || (NAN(dVar23) || NAN(*pdVar3)));
    uVar21 = SUB84(ABS(*pdVar16),0);
    uVar22 = (undefined4)((ulong)ABS(*pdVar16) >> 0x20);
    uVar11 = 0;
    lVar14 = -2;
    do {
      dVar23 = ABS(pdVar12[lVar14]);
      if ((double)CONCAT44(uVar22,uVar21) <= dVar23 && dVar23 != (double)CONCAT44(uVar22,uVar21)) {
        uVar11 = (int)lVar14 + 3;
      }
      if (dVar23 <= (double)CONCAT44(uVar22,uVar21)) {
        dVar23 = (double)CONCAT44(uVar22,uVar21);
      }
      uVar21 = SUB84(dVar23,0);
      uVar22 = (undefined4)((ulong)dVar23 >> 0x20);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0);
    uVar15 = (ulong)uVar11;
    if (uVar11 + 1 != (int)uVar1) {
      dVar23 = (w->super_Vector<double,_3U>).data_[uVar15];
      (w->super_Vector<double,_3U>).data_[uVar15] = (w->super_Vector<double,_3U>).data_[uVar19];
      (w->super_Vector<double,_3U>).data_[uVar19] = dVar23;
      lVar14 = 0;
      do {
        dVar23 = *pdVar16;
        *pdVar16 = (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[uVar15]
                   [lVar14];
        (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[uVar15][lVar14] =
             dVar23;
        lVar14 = lVar14 + 1;
        pdVar16 = pdVar16 + 1;
      } while (lVar14 != 3);
    }
    pdVar12 = (double *)
              ((long)(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ +
              uVar15 * 0x20);
    dVar23 = 0.0;
    if (*pdVar12 <= 0.0 && *pdVar12 != 0.0) {
      padVar18 = (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + uVar15;
      dVar24 = (*padVar18)[1];
      padVar4 = (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + uVar15;
      (*padVar4)[0] = -(*padVar18)[0];
      (*padVar4)[1] = -dVar24;
      (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[uVar15][2] =
           -(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[uVar15][2];
    }
    uVar13 = ((int)(uVar11 + 1) / 3) * -3 + uVar11 + 1;
    padVar18 = (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + uVar13;
    (*padVar18)[0] = 0.0;
    (*padVar18)[1] = 0.0;
    (*padVar18)[2] = 0.0;
    (*padVar18)[uVar13] = 1.0;
    local_38 = (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[uVar15][0];
    pdVar12 = (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[uVar15] + 1;
    local_28 = *pdVar12;
    dStack_20 = pdVar12[1];
    local_b8[0] = (*padVar18)[2] * local_28 - (*padVar18)[1] * dStack_20;
    local_b8[1] = (*padVar18)[0] * dStack_20 - (*padVar18)[2] * local_38;
    local_b8[2] = local_38 * (*padVar18)[1] - (*padVar18)[0] * local_28;
    lVar14 = 0;
    do {
      dVar23 = dVar23 + local_b8[lVar14] * local_b8[lVar14];
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    local_48 = dStack_20;
    dStack_40 = local_38;
    if (dVar23 < 0.0) {
      uStack_30 = 0;
      dVar23 = sqrt(dVar23);
    }
    else {
      dVar23 = SQRT(dVar23);
    }
    lVar14 = 0;
    do {
      local_b8[lVar14] = local_b8[lVar14] / dVar23;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    padVar18 = (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + uVar13;
    (*padVar18)[0] = local_48 * local_b8[1] - local_28 * local_b8[2];
    (*padVar18)[1] = dStack_40 * local_b8[2] - dStack_20 * local_b8[0];
    (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[uVar13][2] =
         local_28 * local_b8[0] - local_38 * local_b8[1];
    uVar11 = (int)(uVar11 + 2) % 3;
    (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[uVar11][2] =
         local_b8[2];
    padVar18 = (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + uVar11;
    (*padVar18)[0] = local_b8[0];
    (*padVar18)[1] = local_b8[1];
    pdVar12 = local_98;
    local_98[6] = 0.0;
    local_98[7] = 0.0;
    local_98[4] = 0.0;
    local_98[5] = 0.0;
    local_98[2] = 0.0;
    local_98[3] = 0.0;
    local_98[0] = 0.0;
    local_98[1] = 0.0;
    local_98[8] = 0.0;
    lVar14 = 0;
    padVar18 = (double (*) [3])v;
    do {
      lVar17 = 0;
      pdVar16 = pdVar12;
      do {
        *pdVar16 = (((SquareMatrix<double,_3> *)*padVar18)->super_RectMatrix<double,_3U,_3U>).data_
                   [0][lVar17];
        lVar17 = lVar17 + 1;
        pdVar16 = pdVar16 + 3;
      } while (lVar17 != 3);
      lVar14 = lVar14 + 1;
      pdVar12 = pdVar12 + 1;
      padVar18 = padVar18 + 1;
    } while (lVar14 != 3);
    lVar14 = 0;
    do {
      *(undefined8 *)
       ((long)(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0] +
       lVar14 + 0x10) = *(undefined8 *)((long)local_98 + lVar14 + 0x10);
      uVar7 = *(undefined8 *)((long)local_98 + lVar14 + 8);
      puVar2 = (undefined8 *)
               ((long)(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0] +
               lVar14);
      *puVar2 = *(undefined8 *)((long)local_98 + lVar14);
      puVar2[1] = uVar7;
      lVar14 = lVar14 + 0x18;
    } while (lVar14 != 0x48);
  }
  else {
    pdVar12 = local_98;
    local_98[6] = 0.0;
    local_98[7] = 0.0;
    local_98[4] = 0.0;
    local_98[5] = 0.0;
    local_98[2] = 0.0;
    local_98[3] = 0.0;
    local_98[0] = 0.0;
    local_98[1] = 0.0;
    local_98[8] = 0.0;
    lVar14 = 0;
    do {
      lVar17 = 0;
      do {
        dVar23 = 1.0;
        if (lVar14 != lVar17) {
          dVar23 = 0.0;
        }
        pdVar12[lVar17] = dVar23;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 3);
      lVar14 = lVar14 + 1;
      pdVar12 = pdVar12 + 3;
    } while (lVar14 != 3);
    lVar14 = 0;
    do {
      *(undefined8 *)
       ((long)(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0] +
       lVar14 + 0x10) = *(undefined8 *)((long)local_98 + lVar14 + 0x10);
      uVar7 = *(undefined8 *)((long)local_98 + lVar14 + 8);
      puVar2 = (undefined8 *)
               ((long)(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0] +
               lVar14);
      *puVar2 = *(undefined8 *)((long)local_98 + lVar14);
      puVar2[1] = uVar7;
      lVar14 = lVar14 + 0x18;
    } while (lVar14 != 0x48);
  }
  return;
}

Assistant:

void SquareMatrix3<Real>::diagonalize(SquareMatrix3<Real>& a,
                                        Vector3<Real>& w,
                                        SquareMatrix3<Real>& v) {
    int i, j, k, maxI;
    Real tmp, maxVal;
    Vector3<Real> v_maxI, v_k, v_j;

    // diagonalize using Jacobi
    SquareMatrix3<Real>::jacobi(a, w, v);
    // if all the eigenvalues are the same, return identity matrix
    if (w[0] == w[1] && w[0] == w[2]) {
      v = SquareMatrix3<Real>::identity();
      return;
    }

    // transpose temporarily, it makes it easier to sort the eigenvectors
    v = v.transpose();

    // if two eigenvalues are the same, re-orthogonalize to optimally line
    // up the eigenvectors with the x, y, and z axes
    for (i = 0; i < 3; i++) {
      if (w((i + 1) % 3) == w((i + 2) % 3)) {  // two eigenvalues are the same
        // find maximum element of the independant eigenvector
        maxVal = fabs(v(i, 0));
        maxI   = 0;
        for (j = 1; j < 3; j++) {
          if (maxVal < (tmp = fabs(v(i, j)))) {
            maxVal = tmp;
            maxI   = j;
          }
        }

        // swap the eigenvector into its proper position
        if (maxI != i) {
          tmp     = w(maxI);
          w(maxI) = w(i);
          w(i)    = tmp;

          v.swapRow(i, maxI);
        }
        // maximum element of eigenvector should be positive
        if (v(maxI, maxI) < 0) {
          v(maxI, 0) = -v(maxI, 0);
          v(maxI, 1) = -v(maxI, 1);
          v(maxI, 2) = -v(maxI, 2);
        }

        // re-orthogonalize the other two eigenvectors
        j = (maxI + 1) % 3;
        k = (maxI + 2) % 3;

        v(j, 0) = 0.0;
        v(j, 1) = 0.0;
        v(j, 2) = 0.0;
        v(j, j) = 1.0;

        /** @todo */
        v_maxI = v.getRow(maxI);
        v_j    = v.getRow(j);
        v_k    = cross(v_maxI, v_j);
        v_k.normalize();
        v_j = cross(v_k, v_maxI);
        v.setRow(j, v_j);
        v.setRow(k, v_k);

        // transpose vectors back to columns
        v = v.transpose();
        return;
      }
    }

    // the three eigenvalues are different, just sort the eigenvectors
    // to align them with the x, y, and z axes

    // find the vector with the largest x element, make that vector
    // the first vector
    maxVal = fabs(v(0, 0));
    maxI   = 0;
    for (i = 1; i < 3; i++) {
      if (maxVal < (tmp = fabs(v(i, 0)))) {
        maxVal = tmp;
        maxI   = i;
      }
    }

    // swap eigenvalue and eigenvector
    if (maxI != 0) {
      tmp     = w(maxI);
      w(maxI) = w(0);
      w(0)    = tmp;
      v.swapRow(maxI, 0);
    }
    // do the same for the y element
    if (fabs(v(1, 1)) < fabs(v(2, 1))) {
      tmp  = w(2);
      w(2) = w(1);
      w(1) = tmp;
      v.swapRow(2, 1);
    }

    // ensure that the sign of the eigenvectors is correct
    for (i = 0; i < 2; i++) {
      if (v(i, i) < 0) {
        v(i, 0) = -v(i, 0);
        v(i, 1) = -v(i, 1);
        v(i, 2) = -v(i, 2);
      }
    }

    // set sign of final eigenvector to ensure that determinant is positive
    if (v.determinant() < 0) {
      v(2, 0) = -v(2, 0);
      v(2, 1) = -v(2, 1);
      v(2, 2) = -v(2, 2);
    }

    // transpose the eigenvectors back again
    v = v.transpose();
    return;
  }